

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::SymbolicStrongSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  bool bVar1;
  SENode *node;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  Loop *local_80;
  Loop *subscript_loop;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  SENode *source_destination_delta;
  string local_58;
  DistanceEntry *local_38;
  DistanceEntry *distance_entry_local;
  SENode *coefficient_local;
  SENode *destination_local;
  SENode *source_local;
  LoopDependenceAnalysis *this_local;
  
  local_38 = distance_entry;
  distance_entry_local = (DistanceEntry *)coefficient;
  coefficient_local = destination;
  destination_local = source;
  source_local = (SENode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Performing SymbolicStrongSIVTest.",
             (allocator<char> *)((long)&source_destination_delta + 7));
  PrintDebug(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&source_destination_delta + 7));
  node = ScalarEvolutionAnalysis::CreateSubtraction
                   (&this->scalar_evolution_,destination_local,coefficient_local);
  subscript_pair.second = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,node)
  ;
  _subscript_loop =
       std::make_pair<spvtools::opt::SENode*&,spvtools::opt::SENode*&>
                 (&destination_local,&coefficient_local);
  local_80 = GetLoopForSubscriptPair
                       (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                             &subscript_loop);
  bVar1 = IsProvablyOutsideOfLoopBounds
                    (this,local_80,subscript_pair.second,(SENode *)distance_entry_local);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"SymbolicStrongSIVTest proved independence through loop bounds.",
               &local_a1);
    PrintDebug(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    local_38->dependence_information = DIRECTION;
    local_38->direction = NONE;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "SymbolicStrongSIVTest was unable to determine any dependence information.",&local_c9
              );
    PrintDebug(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    local_38->direction = ALL;
  }
  return bVar1;
}

Assistant:

bool LoopDependenceAnalysis::SymbolicStrongSIVTest(
    SENode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing SymbolicStrongSIVTest.");
  SENode* source_destination_delta = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateSubtraction(source, destination));
  // By cancelling out the induction variables by subtracting the source and
  // destination we can produce an expression of symbolics and constants. This
  // expression can be compared to the loop bounds to find if the offset is
  // outwith the bounds.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  if (IsProvablyOutsideOfLoopBounds(subscript_loop, source_destination_delta,
                                    coefficient)) {
    PrintDebug(
        "SymbolicStrongSIVTest proved independence through loop bounds.");
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DIRECTION;
    distance_entry->direction = DistanceEntry::Directions::NONE;
    return true;
  }
  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "SymbolicStrongSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}